

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O0

unsigned_long ndiGetPSTATCurrentTest(ndicapi *pol,int port)

{
  char (*local_28) [8];
  char *dp;
  int port_local;
  ndicapi *pol_local;
  
  if ((port < 0x31) || (0x33 < port)) {
    if ((port < 0x41) || (0x49 < port)) {
      return 0;
    }
    local_28 = pol->PstatPassiveTesting + (port + -0x41);
  }
  else {
    local_28 = pol->PstatTesting + (port + -0x31);
  }
  if ((*local_28)[0] == '\0') {
    pol_local = (ndicapi *)0x0;
  }
  else {
    pol_local = (ndicapi *)ndiHexToUnsignedLong(*local_28,8);
  }
  return (unsigned_long)pol_local;
}

Assistant:

ndicapiExport unsigned long ndiGetPSTATCurrentTest(ndicapi* pol, int port)
{
  char* dp;

  if (port >= '1' && port <= '3')
  {
    dp = pol->PstatTesting[port - '1'];
  }
  else if (port >= 'A' && port <= 'I')
  {
    dp = pol->PstatPassiveTesting[port - 'A'];
  }
  else
  {
    return 0;
  }

  if (*dp == '\0')
  {
    return 0;
  }

  return (unsigned long)ndiHexToUnsignedLong(dp, 8);
}